

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *
jbcoin::STObject::getSortedFields
          (vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
           *__return_storage_ptr__,STObject *objToSort)

{
  bool bVar1;
  int iVar2;
  SField *this;
  __normal_iterator<const_jbcoin::STBase_*const_*,_std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>_>
  local_98;
  STBase **local_90;
  __normal_iterator<const_jbcoin::STBase_*const_*,_std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>_>
  local_88;
  __normal_iterator<const_jbcoin::STBase_*const_*,_std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>_>
  local_80 [2];
  STBase **local_70;
  STBase **local_68;
  STBase *local_60;
  STBase *local_58;
  STBase *base;
  STVar *elem;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  STObject *objToSort_local;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *sf;
  
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::vector
            (__return_storage_ptr__);
  iVar2 = getCount(objToSort);
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::reserve
            (__return_storage_ptr__,(long)iVar2);
  __end1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                     (&objToSort->v_);
  elem = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::end
                            (&objToSort->v_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                     *)&elem), bVar1) {
    base = (STBase *)
           __gnu_cxx::
           __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
           ::operator*(&__end1);
    local_58 = jbcoin::detail::STVar::get((STVar *)base);
    iVar2 = (*local_58->_vptr_STBase[4])();
    if (iVar2 != 0) {
      this = STBase::getFName(local_58);
      bVar1 = SField::shouldInclude(this,true);
      if (bVar1) {
        local_60 = local_58;
        std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::push_back
                  (__return_storage_ptr__,&local_60);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
    ::operator++(&__end1);
  }
  local_68 = (STBase **)
             std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::begin
                       (__return_storage_ptr__);
  local_70 = (STBase **)
             std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::end
                       (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>
            (local_68,local_70);
  local_88._M_current =
       (STBase **)
       std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::cbegin
                 (__return_storage_ptr__);
  local_90 = (STBase **)
             std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::cend
                       (__return_storage_ptr__);
  local_80[0] = std::
                adjacent_find<__gnu_cxx::__normal_iterator<jbcoin::STBase_const*const*,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>>
                          (local_88,(__normal_iterator<const_jbcoin::STBase_*const_*,_std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>_>
                                     )local_90);
  local_98._M_current =
       (STBase **)
       std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::cend
                 (__return_storage_ptr__);
  bVar1 = __gnu_cxx::operator==(local_80,&local_98);
  if (!bVar1) {
    __assert_fail("std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2f4,
                  "static std::vector<const STBase *> jbcoin::STObject::getSortedFields(const STObject &)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STBase const*>
STObject::getSortedFields (STObject const& objToSort)
{
    std::vector<STBase const*> sf;
    sf.reserve (objToSort.getCount ());

    // Choose the fields that we need to sort.
    for (detail::STVar const& elem : objToSort.v_)
    {
        // Pick out the fields and sort them.
        STBase const& base = elem.get();
        if ((base.getSType () != STI_NOTPRESENT) &&
            base.getFName ().shouldInclude (true))
        {
            sf.push_back (&base);
        }
    }

    // Sort the fields by fieldCode.
    std::sort (sf.begin (), sf.end (),
        [] (STBase const* a, STBase const* b) -> bool
        {
            return a->getFName ().fieldCode < b->getFName ().fieldCode;
        });

    // There should never be duplicate fields in an STObject. Verify that
    // in debug mode.
    assert (std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ());

    return sf;
}